

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.cpp
# Opt level: O0

bool __thiscall
tonk::ConnectionAddrMap::ChangeAddress
          (ConnectionAddrMap *this,UDPAddress *oldAddress,UDPAddress *newAddress,
          IConnection *connection)

{
  undefined1 uVar1;
  bool bVar2;
  insert_result iVar3;
  long in_RCX;
  basic_endpoint<asio::ip::udp> *in_RDI;
  Locker locker;
  insert_result result;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  address *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  bool local_21;
  
  Locker::Locker((Locker *)in_stack_ffffffffffffff20,
                 (Lock *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  if (*(long *)&in_RDI[4].impl_.data_ == in_RCX) {
    asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
              ((basic_endpoint<asio::ip::udp> *)0x170a52);
    asio::ip::basic_endpoint<asio::ip::udp>::operator=
              ((basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffff20,
               (basic_endpoint<asio::ip::udp> *)
               CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    *(undefined8 *)&in_RDI[4].impl_.data_ = 0;
  }
  asio::ip::basic_endpoint<asio::ip::udp>::address
            ((basic_endpoint<asio::ip::udp> *)
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  uVar1 = asio::ip::address::is_unspecified(in_stack_ffffffffffffff20);
  if (((uVar1 ^ 0xff) & 1) != 0) {
    ConnectionMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::UDPAddressHasher>::Remove
              ((ConnectionMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::UDPAddressHasher> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),in_RDI,
               (IConnection *)
               CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
  }
  asio::ip::basic_endpoint<asio::ip::udp>::address
            ((basic_endpoint<asio::ip::udp> *)
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  bVar2 = asio::ip::address::is_unspecified(in_stack_ffffffffffffff20);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_21 = true;
  }
  else {
    iVar3 = LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
            ::insert((LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
                      *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),in_RDI,
                     (IConnection **)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff28)));
    local_21 = (bool)(iVar3.second & 1);
  }
  Locker::~Locker((Locker *)0x170bca);
  return local_21;
}

Assistant:

bool ConnectionAddrMap::ChangeAddress(
    const UDPAddress& oldAddress,
    const UDPAddress& newAddress,
    IConnection* connection)
{
    Locker locker(AddressMapLock);

    // Remove from recent list
    if (RecentConnection == connection)
    {
        RecentAddress = UDPAddress();
        RecentConnection = nullptr;
    }

    if (!oldAddress.address().is_unspecified()) {
        AddressMap.Remove(oldAddress, connection);
    }
    if (!newAddress.address().is_unspecified()) {
        return AddressMap.Insert(newAddress, connection);
    }

    // If new address is unspecified, return true
    return true;
}